

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondPersistence.cpp
# Opt level: O0

void __thiscall OpenMD::HBondPersistence::postCorrelate(HBondPersistence *this)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RDI;
  uint i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(uint *)(in_RDI + 0x38); local_c = local_c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(ulong)local_c);
    if (*pvVar2 < 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(ulong)local_c)
      ;
      *pvVar3 = 0.0;
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(ulong)local_c);
      iVar1 = *pvVar2;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),(ulong)local_c)
      ;
      *pvVar3 = *pvVar3 / (double)iVar1;
    }
  }
  return;
}

Assistant:

void HBondPersistence::postCorrelate() {
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      if (count_[i] > 0) {
        histogram_[i] /= count_[i];
      } else {
        histogram_[i] = 0;
      }
    }
  }